

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimingControl.cpp
# Opt level: O2

TimingControl *
slang::ast::Delay3Control::fromSyntax
          (Compilation *compilation,Delay3Syntax *syntax,ASTContext *context)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Delay3Control *ctrl;
  TimingControl *pTVar3;
  Expression *expr3;
  Expression *expr2;
  anon_class_8_1_bc11688f checkType;
  Expression *local_40;
  Expression *local_38;
  SourceRange local_30;
  Expression *args;
  
  iVar2 = Expression::bind((int)(syntax->delay1).ptr,(sockaddr *)context,0);
  args = (Expression *)CONCAT44(extraout_var,iVar2);
  local_38 = (Expression *)0x0;
  if (syntax->delay2 != (ExpressionSyntax *)0x0) {
    iVar2 = Expression::bind((int)syntax->delay2,(sockaddr *)context,0);
    local_38 = (Expression *)CONCAT44(extraout_var_00,iVar2);
  }
  local_40 = (Expression *)0x0;
  if (syntax->delay3 != (ExpressionSyntax *)0x0) {
    iVar2 = Expression::bind((int)syntax->delay3,(sockaddr *)context,0);
    local_40 = (Expression *)CONCAT44(extraout_var_01,iVar2);
  }
  local_30 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  ctrl = BumpAllocator::
         emplace<slang::ast::Delay3Control,slang::ast::Expression_const&,slang::ast::Expression_const*&,slang::ast::Expression_const*&,slang::SourceRange>
                   (&compilation->super_BumpAllocator,args,&local_38,&local_40,&local_30);
  bVar1 = Expression::bad(args);
  if ((!bVar1) && ((local_38 == (Expression *)0x0 || (bVar1 = Expression::bad(local_38), !bVar1))))
  {
    if (local_40 != (Expression *)0x0) {
      bVar1 = Expression::bad(local_40);
      if (bVar1) goto LAB_003810ff;
    }
    local_30.startLoc = (SourceLocation)context;
    bVar1 = fromSyntax::anon_class_8_1_bc11688f::operator()
                      ((anon_class_8_1_bc11688f *)&local_30,args);
    if ((bVar1) &&
       ((local_38 == (Expression *)0x0 ||
        (bVar1 = fromSyntax::anon_class_8_1_bc11688f::operator()
                           ((anon_class_8_1_bc11688f *)&local_30,local_38), bVar1)))) {
      if (local_40 == (Expression *)0x0) {
        return &ctrl->super_TimingControl;
      }
      bVar1 = fromSyntax::anon_class_8_1_bc11688f::operator()
                        ((anon_class_8_1_bc11688f *)&local_30,local_40);
      if (bVar1) {
        return &ctrl->super_TimingControl;
      }
    }
  }
LAB_003810ff:
  pTVar3 = TimingControl::badCtrl(compilation,&ctrl->super_TimingControl);
  return pTVar3;
}

Assistant:

TimingControl& Delay3Control::fromSyntax(Compilation& compilation, const Delay3Syntax& syntax,
                                         const ASTContext& context) {
    auto& expr1 = Expression::bind(*syntax.delay1, context);

    const Expression* expr2 = nullptr;
    if (syntax.delay2)
        expr2 = &Expression::bind(*syntax.delay2, context);

    const Expression* expr3 = nullptr;
    if (syntax.delay3)
        expr3 = &Expression::bind(*syntax.delay3, context);

    auto result = compilation.emplace<Delay3Control>(expr1, expr2, expr3, syntax.sourceRange());
    if (expr1.bad() || (expr2 && expr2->bad()) || (expr3 && expr3->bad()))
        return badCtrl(compilation, result);

    auto checkType = [&](const Expression& expr) {
        if (!expr.type->isNumeric()) {
            context.addDiag(diag::DelayNotNumeric, expr.sourceRange) << *expr.type;
            return false;
        }
        return true;
    };

    if (!checkType(expr1) || (expr2 && !checkType(*expr2)) || (expr3 && !checkType(*expr3)))
        return badCtrl(compilation, result);

    return *result;
}